

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall ON_OBSOLETE_V5_Leader::Transform(ON_OBSOLETE_V5_Leader *this,ON_Xform *xform)

{
  ON_Plane *this_00;
  int c;
  ON_2dPoint *pOVar1;
  ON_3dPoint p;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ON_Plane *pOVar7;
  ON_Plane *pOVar8;
  byte bVar9;
  ON_2dVector OVar10;
  ON_2dPoint q2;
  ON_2dVector local_140;
  ON_3dPoint local_130;
  ON_2dPointArray *local_118;
  double local_110;
  double local_108;
  ON_2dPointArray q;
  ON_3dPoint P;
  ON_Plane plane;
  
  bVar9 = 0;
  bVar2 = ON_Xform::IsIdentity(xform,0.0);
  bVar3 = true;
  if (!bVar2) {
    this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
    pOVar7 = this_00;
    pOVar8 = &plane;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pOVar8->origin).x = (pOVar7->origin).x;
      pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar9 * -0x10 + 8);
      pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    bVar2 = ON_Plane::Transform(&plane,xform);
    if (bVar2) {
      c = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
      ON_2dPointArray::ON_2dPointArray(&q,c);
      local_118 = &(this->super_ON_OBSOLETE_V5_Annotation).m_points;
      bVar3 = true;
      lVar5 = 8;
      lVar6 = 0;
      bVar2 = false;
      while ((lVar6 < c && (bVar3 != false))) {
        pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                 m_a;
        local_110 = *(double *)((long)pOVar1 + lVar5 + -8);
        local_108 = *(double *)((long)&pOVar1->x + lVar5);
        ON_Plane::PointAt(&local_130,this_00,local_110,local_108);
        P.z = local_130.z;
        P.x = local_130.x;
        P.y = local_130.y;
        ON_Xform::operator*(&local_130,xform,&P);
        p.y = local_130.y;
        p.x = local_130.x;
        p.z = local_130.z;
        bVar3 = ON_Plane::ClosestPointTo(&plane,p,&q2.x,&q2.y);
        bVar4 = true;
        if (ABS(local_110 - q2.x) <= 1.490116119385e-08) {
          q2.x = local_110;
          bVar4 = bVar2;
        }
        bVar2 = true;
        if (ABS(local_108 - q2.y) <= 1.490116119385e-08) {
          q2.y = local_108;
          bVar2 = bVar4;
        }
        ON_SimpleArray<ON_2dPoint>::Append(&q.super_ON_SimpleArray<ON_2dPoint>,&q2);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x10;
      }
      if (bVar3 != false) {
        ON_Geometry::Transform((ON_Geometry *)this,xform);
        lVar5 = 0x10;
        pOVar7 = &plane;
        pOVar8 = this_00;
        for (lVar6 = lVar5; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pOVar8->origin).x = (pOVar7->origin).x;
          pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar9 * -0x10 + 8);
          pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
        }
        if (bVar2) {
          ON_2dPointArray::operator=(local_118,&q);
        }
        pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                 m_a;
        if ((((pOVar1->x != 0.0) || (NAN(pOVar1->x))) || (pOVar1->y != 0.0)) || (NAN(pOVar1->y))) {
          ON_2dVector::ON_2dVector(&local_140,pOVar1);
          bVar2 = ON_2dVector::IsZero(&local_140);
          if (!bVar2) {
            ON_Plane::PointAt(&local_130,this_00,local_140.x,local_140.y);
            (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.z = local_130.z;
            (this_00->origin).x = local_130.x;
            (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.y = local_130.y;
            ON_Plane::UpdateEquation(this_00);
            OVar10 = ON_2dVector::operator-(&local_140);
            local_140.y = OVar10.y;
            local_140.x = OVar10.x;
            for (lVar6 = 1;
                pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>.m_a, lVar6 < c; lVar6 = lVar6 + 1) {
              ON_2dPoint::operator+=((ON_2dPoint *)((long)&pOVar1->x + lVar5),&local_140);
              lVar5 = lVar5 + 0x10;
            }
            ON_2dPoint::Set(pOVar1,0.0,0.0);
          }
        }
      }
      ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&q.super_ON_SimpleArray<ON_2dPoint>);
    }
    else {
      bVar3 = false;
    }
    ON_Plane::~ON_Plane(&plane);
  }
  return bVar3;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::Transform( const ON_Xform& xform )
{
  bool rc = xform.IsIdentity();
  if ( !rc)
  {
    ON_Plane plane = m_plane;
    rc = plane.Transform(xform);
    if ( rc )
    {
      int i;
      const int point_count =  m_points.Count();
      ON_2dPointArray q(point_count);
      ON_2dPoint p2, q2;
      ON_3dPoint P, Q;
      bool bUpdatePoints = false;
      for ( i = 0; i < point_count && rc; i++ )
      {
        p2 = m_points[i];
        P = m_plane.PointAt( p2.x, p2.y );
        Q = xform*P;
        if( !plane.ClosestPointTo(Q,&q2.x,&q2.y) )
          rc = false;
        if ( fabs(p2.x - q2.x) <= ON_SQRT_EPSILON )
          q2.x = p2.x;
        else
          bUpdatePoints = true;
        if ( fabs(p2.y - q2.y) <= ON_SQRT_EPSILON )
          q2.y = p2.y;
        else
          bUpdatePoints = true;
        q.Append(q2);
      }

      if(rc)
      {
        ON_Geometry::Transform(xform);
        m_plane = plane;

        if ( bUpdatePoints )
          m_points = q;

        if ( m_points[0].x != 0.0 || m_points[0].y != 0.0 )
        {
          ON_2dVector v = m_points[0];
          if ( !v.IsZero() )
          {
            m_plane.origin = m_plane.PointAt(v.x,v.y);
            m_plane.UpdateEquation();
            v = -v;
            for ( i = 1; i < point_count; i++ )
            {
              m_points[i] += v;
            }
            m_points[0].Set(0.0,0.0);
          }
        }
      }
    }
  }
  return rc;
}